

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

bool __thiscall Assimp::MD3Importer::ReadMultipartFile(MD3Importer *this)

{
  string *psVar1;
  bool bVar2;
  __type _Var3;
  uint which;
  uint which_00;
  uint which_01;
  Logger *pLVar4;
  aiScene *this_00;
  aiNode *paVar5;
  aiScene *this_01;
  aiScene *this_02;
  aiScene *this_03;
  DeadlyImportError *this_04;
  bool bVar6;
  char *message;
  aiScene **_dest;
  BatchLoader batch;
  allocator<char> local_1f1;
  MD3Importer *local_1f0;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> attach;
  string failure;
  string head;
  string upper;
  string local_170;
  string mod_filename;
  string suffix;
  string lower;
  PropertyMap props;
  
  psVar1 = &this->filename;
  local_1f0 = this;
  std::__cxx11::string::rfind((char)psVar1,0x5f);
  std::__cxx11::string::rfind((char)psVar1,0x2e);
  std::__cxx11::string::substr((ulong)&mod_filename,(ulong)psVar1);
  std::__cxx11::string::substr((ulong)&suffix,(ulong)psVar1);
  bVar2 = std::operator==(&mod_filename,"lower");
  if (((bVar2) || (bVar2 = std::operator==(&mod_filename,"upper"), bVar2)) ||
     (bVar2 = std::operator==(&mod_filename,"head"), bVar2)) {
    psVar1 = &local_1f0->path;
    std::operator+(&upper,psVar1,"lower");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props,
                   &upper,&suffix);
    std::operator+(&lower,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &props,".md3");
    std::__cxx11::string::~string((string *)&props);
    std::__cxx11::string::~string((string *)&upper);
    std::operator+(&head,psVar1,"upper");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props,&head
                   ,&suffix);
    std::operator+(&upper,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &props,".md3");
    std::__cxx11::string::~string((string *)&props);
    std::__cxx11::string::~string((string *)&head);
    std::operator+(&failure,psVar1,"head");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props,
                   &failure,&suffix);
    std::operator+(&head,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props
                   ,".md3");
    std::__cxx11::string::~string((string *)&props);
    std::__cxx11::string::~string((string *)&failure);
    failure._M_dataplus._M_p = (pointer)&failure.field_2;
    failure._M_string_length = 0;
    failure.field_2._M_local_buf[0] = '\0';
    attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pLVar4 = DefaultLogger::get();
    Logger::info(pLVar4,"Multi part MD3 player model: lower, upper and head parts are joined");
    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &props.ints._M_t._M_impl.super__Rb_tree_header._M_header;
    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &props.floats._M_t._M_impl.super__Rb_tree_header._M_header;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &props.strings._M_t._M_impl.super__Rb_tree_header._M_header;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &props.matrices._M_t._M_impl.super__Rb_tree_header._M_header;
    props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_170._M_dataplus._M_p = (pointer)((ulong)local_170._M_dataplus._M_p._4_4_ << 0x20);
    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    SetGenericProperty<int>(&props.ints,"IMPORT_MD3_HANDLE_MULTIPART",(int *)&local_170);
    BatchLoader::BatchLoader(&batch,local_1f0->mIOHandler,false);
    which = BatchLoader::AddLoadRequest(&batch,&lower,0,&props);
    which_00 = BatchLoader::AddLoadRequest(&batch,&upper,0,&props);
    which_01 = BatchLoader::AddLoadRequest(&batch,&head,0,&props);
    BatchLoader::LoadAll(&batch);
    this_00 = (aiScene *)operator_new(0x80);
    aiScene::aiScene(this_00);
    paVar5 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar5);
    this_00->mRootNode = paVar5;
    aiString::Set((aiString *)paVar5,"<MD3_Player>");
    this_01 = BatchLoader::GetImport(&batch,which);
    if (this_01 == (aiScene *)0x0) {
      pLVar4 = DefaultLogger::get();
      Logger::error(pLVar4,"M3D: Failed to read multi part model, lower.md3 fails to load");
LAB_0042e247:
      std::__cxx11::string::assign((char *)&failure);
      this_02 = (aiScene *)0x0;
      this_03 = (aiScene *)0x0;
LAB_0042e2ad:
      operator_delete(this_02,0x80);
      if (this_01 != (aiScene *)0x0) {
        aiScene::~aiScene(this_01);
      }
      operator_delete(this_01,0x80);
      if (this_03 != (aiScene *)0x0) {
        aiScene::~aiScene(this_03);
      }
      operator_delete(this_03,0x80);
      aiScene::~aiScene(this_00);
      operator_delete(this_00,0x80);
      _Var3 = std::operator==(&failure,&mod_filename);
      bVar2 = true;
      if (_Var3) {
        this_04 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"MD3: failure to read multipart host file",&local_1f1);
        DeadlyImportError::DeadlyImportError(this_04,&local_170);
        __cxa_throw(this_04,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      this_02 = BatchLoader::GetImport(&batch,which_00);
      if (this_02 == (aiScene *)0x0) {
        pLVar4 = DefaultLogger::get();
        Logger::error(pLVar4,"M3D: Failed to read multi part model, upper.md3 fails to load");
        goto LAB_0042e247;
      }
      this_03 = BatchLoader::GetImport(&batch,which_01);
      if (this_03 == (aiScene *)0x0) {
        pLVar4 = DefaultLogger::get();
        Logger::error(pLVar4,"M3D: Failed to read multi part model, head.md3 fails to load");
        std::__cxx11::string::assign((char *)&failure);
LAB_0042e2a5:
        aiScene::~aiScene(this_02);
        goto LAB_0042e2ad;
      }
      aiString::Set(&this_01->mRootNode->mName,"lower");
      local_170._M_dataplus._M_p = (pointer)this_01;
      local_170._M_string_length = (size_type)paVar5;
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
      emplace_back<Assimp::AttachmentInfo>(&attach,(AttachmentInfo *)&local_170);
      paVar5 = aiNode::FindNode(this_01->mRootNode,"tag_torso");
      if (paVar5 == (aiNode *)0x0) {
        pLVar4 = DefaultLogger::get();
        message = "M3D: Failed to find attachment tag for multi part model: tag_torso expected";
LAB_0042e29d:
        Logger::error(pLVar4,message);
        goto LAB_0042e2a5;
      }
      aiString::Set(&this_02->mRootNode->mName,"upper");
      local_170._M_dataplus._M_p = (pointer)this_02;
      local_170._M_string_length = (size_type)paVar5;
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
      emplace_back<Assimp::AttachmentInfo>(&attach,(AttachmentInfo *)&local_170);
      paVar5 = aiNode::FindNode(this_02->mRootNode,"tag_head");
      if (paVar5 == (aiNode *)0x0) {
        pLVar4 = DefaultLogger::get();
        message = "M3D: Failed to find attachment tag for multi part model: tag_head expected";
        goto LAB_0042e29d;
      }
      aiString::Set(&this_03->mRootNode->mName,"head");
      local_170._M_dataplus._M_p = (pointer)this_03;
      local_170._M_string_length = (size_type)paVar5;
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
      emplace_back<Assimp::AttachmentInfo>(&attach,(AttachmentInfo *)&local_170);
      paVar5 = aiNode::FindNode(this_02->mRootNode,"tag_torso");
      RemoveSingleNodeFromList(paVar5);
      paVar5 = aiNode::FindNode(this_03->mRootNode,"tag_head");
      RemoveSingleNodeFromList(paVar5);
      paVar5 = this_03->mRootNode;
      (paVar5->mTransformation).a1 = 1.0;
      (paVar5->mTransformation).a2 = 0.0;
      (paVar5->mTransformation).a3 = 0.0;
      (paVar5->mTransformation).a4 = 0.0;
      (paVar5->mTransformation).b1 = 0.0;
      (paVar5->mTransformation).b2 = 1.0;
      (paVar5->mTransformation).b3 = 0.0;
      (paVar5->mTransformation).b4 = 0.0;
      (paVar5->mTransformation).c1 = 0.0;
      (paVar5->mTransformation).c2 = 0.0;
      (paVar5->mTransformation).c3 = 1.0;
      (paVar5->mTransformation).c4 = 0.0;
      (paVar5->mTransformation).d1 = 0.0;
      (paVar5->mTransformation).d2 = 0.0;
      (paVar5->mTransformation).d3 = 0.0;
      (paVar5->mTransformation).d4 = 1.0;
      paVar5 = this_01->mRootNode;
      (paVar5->mTransformation).a1 = 1.0;
      (paVar5->mTransformation).a2 = 0.0;
      (paVar5->mTransformation).a3 = 0.0;
      (paVar5->mTransformation).a4 = 0.0;
      (paVar5->mTransformation).b1 = 0.0;
      (paVar5->mTransformation).b2 = 1.0;
      (paVar5->mTransformation).b3 = 0.0;
      (paVar5->mTransformation).b4 = 0.0;
      (paVar5->mTransformation).c1 = 0.0;
      (paVar5->mTransformation).c2 = 0.0;
      (paVar5->mTransformation).c3 = 1.0;
      (paVar5->mTransformation).c4 = 0.0;
      (paVar5->mTransformation).d1 = 0.0;
      (paVar5->mTransformation).d2 = 0.0;
      (paVar5->mTransformation).d3 = 0.0;
      (paVar5->mTransformation).d4 = 1.0;
      paVar5 = this_02->mRootNode;
      (paVar5->mTransformation).a1 = 1.0;
      (paVar5->mTransformation).a2 = 0.0;
      (paVar5->mTransformation).a3 = 0.0;
      (paVar5->mTransformation).a4 = 0.0;
      (paVar5->mTransformation).b1 = 0.0;
      (paVar5->mTransformation).b2 = 1.0;
      (paVar5->mTransformation).b3 = 0.0;
      (paVar5->mTransformation).b4 = 0.0;
      (paVar5->mTransformation).c1 = 0.0;
      (paVar5->mTransformation).c2 = 0.0;
      (paVar5->mTransformation).c3 = 1.0;
      (paVar5->mTransformation).c4 = 0.0;
      (paVar5->mTransformation).d1 = 0.0;
      (paVar5->mTransformation).d2 = 0.0;
      (paVar5->mTransformation).d3 = 0.0;
      (paVar5->mTransformation).d4 = 1.0;
      _dest = &local_1f0->mScene;
      SceneCombiner::MergeScenes(_dest,this_00,&attach,(local_1f0->configSpeedFlag ^ 1) << 4 | 0xb);
      paVar5 = (*_dest)->mRootNode;
      (paVar5->mTransformation).a1 = 1.0;
      (paVar5->mTransformation).b2 = 0.0;
      (paVar5->mTransformation).a2 = 0.0;
      (paVar5->mTransformation).a3 = 0.0;
      (paVar5->mTransformation).a4 = 0.0;
      (paVar5->mTransformation).b1 = 0.0;
      (paVar5->mTransformation).b3 = 1.0;
      (paVar5->mTransformation).b4 = 0.0;
      (paVar5->mTransformation).c1 = 0.0;
      (paVar5->mTransformation).c2 = -1.0;
      (paVar5->mTransformation).c3 = 0.0;
      (paVar5->mTransformation).c4 = 0.0;
      (paVar5->mTransformation).d1 = 0.0;
      (paVar5->mTransformation).d2 = 0.0;
      (paVar5->mTransformation).d3 = 0.0;
      (paVar5->mTransformation).d4 = 1.0;
      bVar2 = false;
    }
    BatchLoader::~BatchLoader(&batch);
    BatchLoader::PropertyMap::~PropertyMap(&props);
    std::_Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
    ~_Vector_base(&attach.
                   super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 );
    std::__cxx11::string::~string((string *)&failure);
    std::__cxx11::string::~string((string *)&head);
    std::__cxx11::string::~string((string *)&upper);
    std::__cxx11::string::~string((string *)&lower);
    bVar6 = true;
    if (!bVar2) goto LAB_0042e375;
  }
  bVar6 = false;
LAB_0042e375:
  std::__cxx11::string::~string((string *)&suffix);
  std::__cxx11::string::~string((string *)&mod_filename);
  return bVar6;
}

Assistant:

bool MD3Importer::ReadMultipartFile()
{
    // check whether the file name contains a common postfix, e.g lower_2.md3
    std::string::size_type s = filename.find_last_of('_'), t = filename.find_last_of('.');

    if (t == std::string::npos)
        t = filename.size();
    if (s == std::string::npos)
        s = t;

    const std::string mod_filename = filename.substr(0,s);
    const std::string suffix = filename.substr(s,t-s);

    if (mod_filename == "lower" || mod_filename == "upper" || mod_filename == "head"){
        const std::string lower = path + "lower" + suffix + ".md3";
        const std::string upper = path + "upper" + suffix + ".md3";
        const std::string head  = path + "head"  + suffix + ".md3";

        aiScene* scene_upper = NULL;
        aiScene* scene_lower = NULL;
        aiScene* scene_head = NULL;
        std::string failure;

        aiNode* tag_torso, *tag_head;
        std::vector<AttachmentInfo> attach;

        ASSIMP_LOG_INFO("Multi part MD3 player model: lower, upper and head parts are joined");

        // ensure we won't try to load ourselves recursively
        BatchLoader::PropertyMap props;
        SetGenericProperty( props.ints, AI_CONFIG_IMPORT_MD3_HANDLE_MULTIPART, 0);

        // now read these three files
        BatchLoader batch(mIOHandler);
        const unsigned int _lower = batch.AddLoadRequest(lower,0,&props);
        const unsigned int _upper = batch.AddLoadRequest(upper,0,&props);
        const unsigned int _head  = batch.AddLoadRequest(head,0,&props);
        batch.LoadAll();

        // now construct a dummy scene to place these three parts in
        aiScene* master   = new aiScene();
        aiNode* nd = master->mRootNode = new aiNode();
        nd->mName.Set("<MD3_Player>");

        // ... and get them. We need all of them.
        scene_lower = batch.GetImport(_lower);
        if (!scene_lower) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, lower.md3 fails to load");
            failure = "lower";
            goto error_cleanup;
        }

        scene_upper = batch.GetImport(_upper);
        if (!scene_upper) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, upper.md3 fails to load");
            failure = "upper";
            goto error_cleanup;
        }

        scene_head  = batch.GetImport(_head);
        if (!scene_head) {
            ASSIMP_LOG_ERROR("M3D: Failed to read multi part model, head.md3 fails to load");
            failure = "head";
            goto error_cleanup;
        }

        // build attachment infos. search for typical Q3 tags

        // original root
        scene_lower->mRootNode->mName.Set("lower");
        attach.push_back(AttachmentInfo(scene_lower, nd));

        // tag_torso
        tag_torso = scene_lower->mRootNode->FindNode("tag_torso");
        if (!tag_torso) {
            ASSIMP_LOG_ERROR("M3D: Failed to find attachment tag for multi part model: tag_torso expected");
            goto error_cleanup;
        }
        scene_upper->mRootNode->mName.Set("upper");
        attach.push_back(AttachmentInfo(scene_upper,tag_torso));

        // tag_head
        tag_head = scene_upper->mRootNode->FindNode("tag_head");
        if (!tag_head) {
            ASSIMP_LOG_ERROR( "M3D: Failed to find attachment tag for multi part model: tag_head expected");
            goto error_cleanup;
        }
        scene_head->mRootNode->mName.Set("head");
        attach.push_back(AttachmentInfo(scene_head,tag_head));

        // Remove tag_head and tag_torso from all other model parts ...
        // this ensures (together with AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY)
        // that tag_torso/tag_head is also the name of the (unique) output node
        RemoveSingleNodeFromList (scene_upper->mRootNode->FindNode("tag_torso"));
        RemoveSingleNodeFromList (scene_head-> mRootNode->FindNode("tag_head" ));

        // Undo the rotations which we applied to the coordinate systems. We're
        // working in global Quake space here
        scene_head->mRootNode->mTransformation  = aiMatrix4x4();
        scene_lower->mRootNode->mTransformation = aiMatrix4x4();
        scene_upper->mRootNode->mTransformation = aiMatrix4x4();

        // and merge the scenes
        SceneCombiner::MergeScenes(&mScene,master, attach,
            AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES          |
            AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES       |
            AI_INT_MERGE_SCENE_RESOLVE_CROSS_ATTACHMENTS |
            (!configSpeedFlag ? AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY : 0));

        // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
        mScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
            0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);

        return true;

error_cleanup:
        delete scene_upper;
        delete scene_lower;
        delete scene_head;
        delete master;

        if (failure == mod_filename) {
            throw DeadlyImportError("MD3: failure to read multipart host file");
        }
    }
    return false;
}